

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ay8910.c
# Opt level: O2

void ay8910_set_stereo_mask(void *chip,UINT32 StereoMask)

{
  long lVar1;
  
  for (lVar1 = -3; lVar1 != 0; lVar1 = lVar1 + 1) {
    *(byte *)((long)chip + lVar1 + 699) = (byte)StereoMask & 3;
    StereoMask = StereoMask >> 2;
  }
  return;
}

Assistant:

void ay8910_set_stereo_mask(void *chip, UINT32 StereoMask)
{
	ay8910_context *psg = (ay8910_context *)chip;
	UINT8 CurChn;
	
	for (CurChn = 0; CurChn < NUM_CHANNELS; CurChn ++)
	{
		psg->StereoMask[CurChn] = StereoMask & 0x03;
		StereoMask >>= 2;
	}
	
	return;
}